

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::file_rename_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_rename_failed_alert *this)

{
  uint uVar1;
  string local_138;
  string local_118;
  char local_e8 [8];
  char msg [200];
  file_rename_failed_alert *this_local;
  string *ret;
  
  msg[199] = '\0';
  torrent_alert::message_abi_cxx11_(__return_storage_ptr__,&this->super_torrent_alert);
  uVar1 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&this->index);
  snprintf(local_e8,200,": failed to rename file %d: ",(ulong)uVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  boost::system::error_code::message_abi_cxx11_(&local_138,&this->error);
  convert_from_native(&local_118,&local_138);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string file_rename_failed_alert::message() const
	{
		std::string ret { torrent_alert::message() };
		char msg[200];
		std::snprintf(msg, sizeof(msg), ": failed to rename file %d: "
			, static_cast<int>(index));
		ret.append(msg);
		ret.append(convert_from_native(error.message()));
		return ret;
	}